

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O2

void X86_Intel_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  char cVar2;
  cs_detail *pcVar3;
  int reg_00;
  _Bool _Var4;
  uint uVar5;
  uint uVar6;
  x86_reg xVar7;
  undefined8 in_RAX;
  MCOperand *pMVar8;
  int64_t iVar9;
  MCRegisterClass *c;
  char *s;
  ulong uVar10;
  SStream *extraout_RDX;
  SStream *extraout_RDX_00;
  SStream *extraout_RDX_01;
  SStream *extraout_RDX_02;
  SStream *O_00;
  x86_avx_bcast v;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  x86_reg reg2;
  x86_reg reg;
  
  _reg2 = in_RAX;
  uVar5 = MCInst_getOpcode(MI);
  if (uVar5 == 0x1879) {
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 0) {
      pcVar12 = "xstorerng";
LAB_001a1d7d:
      s = cs_strdup(pcVar12);
      for (pcVar12 = s; cVar2 = *pcVar12, cVar2 != '\0'; pcVar12 = pcVar12 + 1) {
        if ((cVar2 == ' ') || (cVar2 == '\t')) {
          *pcVar12 = '\0';
          pcVar12 = pcVar12 + 1;
          break;
        }
      }
      SStream_concat0(O,s);
      if (*pcVar12 != '\0') {
        SStream_concat0(O,anon_var_dwarf_7097e + 0x11);
        do {
          cVar2 = *pcVar12;
          if (cVar2 == '$') {
            if (pcVar12[1] == -1) {
              pcVar13 = pcVar12 + 3;
              if (pcVar12[3] == '\x01') {
                printf64mem(MI,(int)pcVar12[2] - 1,O);
              }
            }
            else {
              pcVar13 = pcVar12 + 1;
              printOperand(MI,(int)pcVar12[1] - 1,O);
            }
          }
          else {
            if (cVar2 == '\0') break;
            SStream_concat(O,"%c",(ulong)(uint)(int)cVar2);
            pcVar13 = pcVar12;
          }
          pcVar12 = pcVar13 + 1;
        } while( true );
      }
      if (s != (char *)0x0) {
        (*cs_mem_free)(s);
        goto switchD_001a1ebb_default;
      }
    }
  }
  else if (uVar5 == 0x16) {
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 1) {
      pMVar8 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isImm(pMVar8);
      if (_Var4) {
        pMVar8 = MCInst_getOperand(MI,0);
        iVar9 = MCOperand_getImm(pMVar8);
        if (iVar9 == 10) {
          pcVar12 = "aam";
          goto LAB_001a1d7d;
        }
      }
    }
  }
  else if (uVar5 == 0x269) {
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 6) {
      pMVar8 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isReg(pMVar8);
      if (_Var4) {
        c = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,0x2a);
        pMVar8 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar8);
        _Var4 = MCRegisterClass_contains(c,uVar5);
        if (_Var4) {
          pcVar12 = anon_var_dwarf_e3219;
          goto LAB_001a1d7d;
        }
      }
    }
  }
  else if (uVar5 == 0x15) {
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 1) {
      pMVar8 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isImm(pMVar8);
      if (_Var4) {
        pMVar8 = MCInst_getOperand(MI,0);
        iVar9 = MCOperand_getImm(pMVar8);
        if (iVar9 == 10) {
          pcVar12 = "aad";
          goto LAB_001a1d7d;
        }
      }
    }
  }
  uVar6 = MCInst_getOpcode(MI);
  uVar5 = *(uint *)(printInstruction_OpInfo + (ulong)uVar6 * 4);
  uVar6 = *(uint *)(printInstruction_OpInfo2 + (ulong)uVar6 * 4);
  _Var4 = X86_lockrep(MI,O);
  if (!_Var4) {
    SStream_concat0(O,(char *)((ulong)(uVar5 & 0x3fff) + 0x33a05f));
  }
  switch(uVar5 >> 0xe & 0x3f) {
  case 1:
    uVar11 = 0;
    goto LAB_001a2035;
  case 2:
    printi16mem(MI,0,O);
    break;
  case 3:
    uVar11 = 1;
LAB_001a2035:
    printOperand(MI,uVar11,O);
    break;
  case 4:
    printi32mem(MI,0,O);
    break;
  case 5:
    printi64mem(MI,0,O);
    break;
  case 6:
    printi8mem(MI,0,O);
    break;
  case 7:
    printf32mem(MI,0,O);
    break;
  case 8:
    printf64mem(MI,0,O);
    break;
  case 9:
    pMVar8 = MCInst_getOperand(MI,0);
    _Var4 = MCOperand_isImm(pMVar8);
    if (_Var4) {
      iVar9 = MCOperand_getImm(pMVar8);
      uVar14 = (ulong)MI->flat_insn->size + iVar9 + MI->address;
      if ((long)uVar14 < 0) {
LAB_001a21c1:
        pcVar12 = " + 0x%lx";
      }
      else {
        uVar10 = uVar14 - 0x10000;
        if (MI->csh->mode != CS_MODE_16) {
          uVar10 = uVar14;
        }
        if (0x100000 < uVar14) {
          uVar14 = uVar10;
        }
        if (9 < (long)uVar14) goto LAB_001a21c1;
        pcVar12 = " + %lu";
      }
      SStream_concat(O,pcVar12 + 3,uVar14);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar3 = MI->flat_insn->detail;
        puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).x86.op_count * 0x30 + 0x3e;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar3 = MI->flat_insn->detail;
        uVar10 = (ulong)(pcVar3->field_6).x86.op_count;
        if (uVar10 == 0) {
          *(uint8_t *)((long)&pcVar3->field_6 + 0x50) = MI->imm_size;
        }
        else {
          pcVar3->groups[uVar10 * 0x30 + 0x5e] = *(uint8_t *)((long)&pcVar3->field_6 + 0x50);
        }
        pcVar3 = MI->flat_insn->detail;
        *(ulong *)(pcVar3->groups + (ulong)(pcVar3->field_6).x86.op_count * 0x30 + 0x46) = uVar14;
        puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
        *puVar1 = *puVar1 + '\x01';
      }
      if (MI->op1_size == '\0') {
        MI->op1_size = MI->imm_size;
      }
    }
    break;
  case 10:
    uVar11 = 7;
    goto LAB_001a2148;
  case 0xb:
    uVar11 = 3;
LAB_001a2148:
    printSSECC(MI,uVar11,O);
    break;
  case 0xc:
    printSrcIdx8(MI,1,O);
    SStream_concat0(O,", ");
    printDstIdx8(MI,0,O);
    goto switchD_001a1ebb_default;
  case 0xd:
    printSrcIdx32(MI,1,O);
    SStream_concat0(O,", ");
    printDstIdx32(MI,0,O);
    goto switchD_001a1ebb_default;
  case 0xe:
    printSrcIdx64(MI,1,O);
    SStream_concat0(O,", ");
    printDstIdx64(MI,0,O);
    goto switchD_001a1ebb_default;
  case 0xf:
    printSrcIdx16(MI,1,O);
    SStream_concat0(O,", ");
    printDstIdx16(MI,0,O);
    goto switchD_001a1ebb_default;
  case 0x10:
    printi128mem(MI,0,O);
    break;
  case 0x11:
    uVar5 = 0;
    goto LAB_001a2621;
  case 0x12:
    printDstIdx8(MI,0,O);
    break;
  case 0x13:
    printDstIdx32(MI,0,O);
    break;
  case 0x14:
    printDstIdx16(MI,0,O);
    break;
  case 0x15:
    uVar11 = 7;
    goto LAB_001a20e2;
  case 0x16:
    uVar11 = 3;
LAB_001a20e2:
    printAVXCC(MI,uVar11,O);
    break;
  case 0x17:
    SStream_concat0(O,"xword ptr ");
    MI->x86opsize = '\n';
    printMemReference(MI,0,O);
    goto switchD_001a1ebb_default;
  case 0x18:
    uVar5 = 0;
    goto LAB_001a26a2;
  case 0x19:
    uVar5 = 0;
    goto LAB_001a25c2;
  case 0x1a:
    uVar5 = 0;
    goto LAB_001a25e8;
  case 0x1b:
    uVar5 = 0;
    goto LAB_001a268f;
  case 0x1c:
    printi16mem(MI,2,O);
    goto LAB_001a2491;
  case 0x1d:
    printi32mem(MI,2,O);
    goto LAB_001a2491;
  case 0x1e:
    printi64mem(MI,2,O);
    goto LAB_001a2491;
  case 0x1f:
    printi8mem(MI,2,O);
    goto LAB_001a2491;
  case 0x20:
    SStream_concat0(O,"word ptr ");
    MI->x86opsize = '\x02';
    O_00 = extraout_RDX_01;
    goto LAB_001a21f6;
  case 0x21:
    SStream_concat0(O,"dword ptr ");
    MI->x86opsize = '\x04';
    O_00 = extraout_RDX_02;
    goto LAB_001a21f6;
  case 0x22:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    O_00 = extraout_RDX_00;
    goto LAB_001a21f6;
  case 0x23:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
    O_00 = extraout_RDX;
LAB_001a21f6:
    printMemOffset(MI,(uint)O,O_00);
    break;
  case 0x24:
    printf128mem(MI,0,O);
    break;
  case 0x25:
    printDstIdx64(MI,0,O);
    break;
  case 0x26:
    printf256mem(MI,0,O);
    break;
  case 0x27:
    printi256mem(MI,0,O);
    break;
  case 0x28:
    printf512mem(MI,0,O);
    break;
  case 0x29:
    printi512mem(MI,0,O);
    break;
  case 0x2a:
    printi32mem(MI,1,O);
    goto LAB_001a2439;
  case 0x2b:
    printi64mem(MI,1,O);
LAB_001a2439:
    SStream_concat0(O," {");
    printOperand(MI,6,O);
    pcVar12 = "}, ";
    goto LAB_001a245d;
  case 0x2c:
    printOperand(MI,2,O);
LAB_001a2491:
    SStream_concat0(O,", ");
    uVar5 = 1;
    goto LAB_001a24a6;
  default:
    goto switchD_001a1ebb_default;
  }
  pcVar12 = ", ";
  switch(uVar5 >> 0x14 & 0x1f) {
  case 1:
    break;
  case 2:
    SStream_concat0(O,", st(0)");
    reg_00 = 0x6a;
    goto LAB_001a2749;
  case 3:
    pcVar12 = "pd\t";
    goto LAB_001a2314;
  case 4:
    pcVar12 = "ps\t";
    goto LAB_001a2314;
  case 5:
    pcVar12 = "sd\t";
    goto LAB_001a2314;
  case 6:
    pcVar12 = "ss\t";
LAB_001a2314:
    SStream_concat0(O,pcVar12);
    uVar11 = 0;
    goto LAB_001a2395;
  case 7:
    SStream_concat0(O,":");
    goto switchD_001a23cc_caseD_18;
  case 8:
    SStream_concat0(O,", dx");
    reg_00 = 0x12;
    goto LAB_001a2749;
  case 9:
    SStream_concat0(O,", ax");
    reg_00 = 3;
    goto LAB_001a2749;
  case 10:
    SStream_concat0(O,", eax");
    reg_00 = 0x13;
    goto LAB_001a2749;
  case 0xb:
    SStream_concat0(O,", rax");
    reg_00 = 0x23;
    goto LAB_001a2749;
  case 0xc:
    SStream_concat0(O,", al");
    reg_00 = 2;
    goto LAB_001a2749;
  case 0xd:
    goto switchD_001a222c_caseD_d;
  case 0xe:
    SStream_concat0(O,", 1");
    op_addImm(MI,1);
  default:
    goto switchD_001a1ebb_default;
  case 0x10:
    pcVar12 = " {";
    break;
  case 0x11:
    pcVar12 = "pd \t";
    goto LAB_001a2368;
  case 0x12:
    pcVar12 = "ps \t";
    goto LAB_001a2368;
  case 0x13:
    pcVar12 = "}, ";
    break;
  case 0x14:
    pcVar12 = "d\t";
    goto LAB_001a2368;
  case 0x15:
    pcVar12 = "q\t";
    goto LAB_001a2368;
  case 0x16:
    pcVar12 = "ud\t";
    goto LAB_001a2368;
  case 0x17:
    pcVar12 = "uq\t";
LAB_001a2368:
    SStream_concat0(O,pcVar12);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    uVar11 = 1;
LAB_001a2395:
    pcVar12 = ", ";
    printOperand(MI,uVar11,O);
  }
  SStream_concat0(O,pcVar12);
  switch(uVar5 >> 0x19 & 0x3f) {
  case 1:
    uVar11 = 2;
    goto LAB_001a26f5;
  case 2:
    uVar11 = 2;
    goto LAB_001a25f7;
  case 3:
    uVar11 = 2;
    goto LAB_001a2643;
  case 4:
    uVar11 = 2;
    goto LAB_001a2630;
  case 5:
    uVar11 = 2;
    goto LAB_001a24ff;
  case 6:
    uVar11 = 2;
    goto LAB_001a25d1;
  case 7:
    printf64mem(MI,2,O);
    break;
  case 8:
    printf32mem(MI,2,O);
    break;
  case 9:
    uVar11 = 1;
LAB_001a2643:
    printi32mem(MI,uVar11,O);
    break;
  case 10:
    uVar11 = 1;
    goto LAB_001a26f5;
  case 0xb:
    uVar11 = 1;
LAB_001a2630:
    printi64mem(MI,uVar11,O);
    break;
  case 0xc:
    uVar11 = 2;
    goto LAB_001a2512;
  case 0xd:
    uVar11 = 1;
LAB_001a2512:
    printi128mem(MI,uVar11,O);
    break;
  case 0xe:
    uVar11 = 1;
LAB_001a25f7:
    printi16mem(MI,uVar11,O);
    break;
  case 0xf:
    uVar11 = 1;
LAB_001a24ff:
    printi8mem(MI,uVar11,O);
    break;
  case 0x10:
    uVar11 = 1;
LAB_001a25d1:
    printf128mem(MI,uVar11,O);
    break;
  case 0x11:
    printf64mem(MI,1,O);
    goto switchD_001a1ebb_default;
  case 0x12:
    printf32mem(MI,1,O);
    goto switchD_001a1ebb_default;
  case 0x13:
    uVar5 = 1;
LAB_001a2621:
    printopaquemem(MI,uVar5,O);
    goto switchD_001a1ebb_default;
  case 0x14:
    uVar5 = 1;
LAB_001a26a2:
    printSrcIdx8(MI,uVar5,O);
    goto switchD_001a1ebb_default;
  case 0x15:
    uVar5 = 1;
LAB_001a25c2:
    printSrcIdx32(MI,uVar5,O);
    goto switchD_001a1ebb_default;
  case 0x16:
    uVar5 = 1;
LAB_001a25e8:
    printSrcIdx64(MI,uVar5,O);
    goto switchD_001a1ebb_default;
  case 0x17:
    uVar5 = 1;
LAB_001a268f:
    printSrcIdx16(MI,uVar5,O);
    goto switchD_001a1ebb_default;
  case 0x18:
switchD_001a23cc_caseD_18:
    uVar5 = 0;
    goto LAB_001a24a6;
  case 0x19:
    printi256mem(MI,1,O);
    break;
  case 0x1a:
    printf512mem(MI,2,O);
    SStream_concat0(O,", ");
    printAVXCC(MI,7,O);
    goto switchD_001a1ebb_default;
  case 0x1b:
    printi512mem(MI,1,O);
    break;
  case 0x1c:
    printf256mem(MI,1,O);
    break;
  case 0x1d:
    printf512mem(MI,1,O);
    break;
  case 0x1e:
    printi64mem(MI,3,O);
    goto LAB_001a26cd;
  case 0x1f:
    printOperand(MI,3,O);
    SStream_concat0(O,"}, ");
    break;
  case 0x20:
    printi32mem(MI,3,O);
LAB_001a26cd:
    SStream_concat0(O,", ");
    goto LAB_001a26dc;
  case 0x21:
    uVar5 = 2;
    goto LAB_001a2678;
  default:
    uVar11 = 5;
LAB_001a26f5:
    printOperand(MI,uVar11,O);
  }
  switch((uint)(CONCAT44(uVar6,uVar5) >> 0x1f) & 0xf) {
  case 1:
    pcVar12 = ", ";
    goto LAB_001a275e;
  case 3:
switchD_001a222c_caseD_d:
    SStream_concat0(O,", cl");
    reg_00 = 10;
LAB_001a2749:
    op_addReg(MI,reg_00);
    break;
  case 4:
    pcVar12 = "}, ";
LAB_001a275e:
    SStream_concat0(O,pcVar12);
LAB_001a277f:
    switch(uVar6 >> 3 & 0x1f) {
    case 1:
      printOperand(MI,2,O);
      switch(uVar6 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a2bbc_caseD_1;
      case 2:
        goto switchD_001a272d_caseD_a;
      case 3:
        goto switchD_001a272d_caseD_9;
      case 4:
        goto switchD_001a2bbc_caseD_4;
      case 5:
        goto switchD_001a2bbc_caseD_5;
      case 6:
switchD_001a272d_caseD_6:
        SStream_concat0(O,", {sae}");
        op_addAvxSae(MI);
        break;
      }
    case 2:
      printi32mem(MI,2,O);
      switch(uVar6 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a2bbc_caseD_1;
      case 2:
        goto switchD_001a272d_caseD_a;
      case 3:
        goto switchD_001a272d_caseD_9;
      case 4:
        goto switchD_001a2bbc_caseD_4;
      case 5:
        goto switchD_001a2bbc_caseD_5;
      case 6:
        goto switchD_001a272d_caseD_6;
      }
    case 3:
      printi64mem(MI,2,O);
      switch(uVar6 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a2bbc_caseD_1;
      case 2:
        goto switchD_001a272d_caseD_a;
      case 3:
        goto switchD_001a272d_caseD_9;
      case 4:
        goto switchD_001a2bbc_caseD_4;
      case 5:
        goto switchD_001a2bbc_caseD_5;
      case 6:
        goto switchD_001a272d_caseD_6;
      }
    case 4:
      goto switchD_001a27a3_caseD_4;
    case 5:
      printOperand(MI,3,O);
      switch(uVar6 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a2bbc_caseD_1;
      case 2:
        goto switchD_001a272d_caseD_a;
      case 3:
        goto switchD_001a272d_caseD_9;
      case 4:
        goto switchD_001a2bbc_caseD_4;
      case 5:
        goto switchD_001a2bbc_caseD_5;
      case 6:
        goto switchD_001a272d_caseD_6;
      }
    case 6:
      printf64mem(MI,2,O);
      switch(uVar6 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a2bbc_caseD_1;
      case 2:
        goto switchD_001a272d_caseD_a;
      case 3:
        goto switchD_001a272d_caseD_9;
      case 4:
        goto switchD_001a2bbc_caseD_4;
      case 5:
        goto switchD_001a2bbc_caseD_5;
      case 6:
        goto switchD_001a272d_caseD_6;
      }
    case 7:
      printf32mem(MI,2,O);
      switch(uVar6 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a2bbc_caseD_1;
      case 2:
        goto switchD_001a272d_caseD_a;
      case 3:
        goto switchD_001a272d_caseD_9;
      case 4:
        goto switchD_001a2bbc_caseD_4;
      case 5:
        goto switchD_001a2bbc_caseD_5;
      case 6:
        goto switchD_001a272d_caseD_6;
      }
    case 8:
      printf256mem(MI,2,O);
      switch(uVar6 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a2bbc_caseD_1;
      case 2:
        goto switchD_001a272d_caseD_a;
      case 3:
        goto switchD_001a272d_caseD_9;
      case 4:
        goto switchD_001a2bbc_caseD_4;
      case 5:
        goto switchD_001a2bbc_caseD_5;
      case 6:
        goto switchD_001a272d_caseD_6;
      }
    case 9:
      printf512mem(MI,2,O);
      switch(uVar6 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a2bbc_caseD_1;
      case 2:
        goto switchD_001a272d_caseD_a;
      case 3:
        goto switchD_001a272d_caseD_9;
      case 4:
        goto switchD_001a2bbc_caseD_4;
      case 5:
        goto switchD_001a2bbc_caseD_5;
      case 6:
        goto switchD_001a272d_caseD_6;
      }
    case 10:
      printf128mem(MI,2,O);
      switch(uVar6 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a2bbc_caseD_1;
      case 2:
        goto switchD_001a272d_caseD_a;
      case 3:
        goto switchD_001a272d_caseD_9;
      case 4:
        goto switchD_001a2bbc_caseD_4;
      case 5:
        goto switchD_001a2bbc_caseD_5;
      case 6:
        goto switchD_001a272d_caseD_6;
      }
    case 0xb:
      printi128mem(MI,2,O);
      switch(uVar6 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a2bbc_caseD_1;
      case 2:
        goto switchD_001a272d_caseD_a;
      case 3:
        goto switchD_001a272d_caseD_9;
      case 4:
        goto switchD_001a2bbc_caseD_4;
      case 5:
        goto switchD_001a2bbc_caseD_5;
      case 6:
        goto switchD_001a272d_caseD_6;
      }
    case 0xc:
      printi512mem(MI,2,O);
      switch(uVar6 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a2bbc_caseD_1;
      case 2:
        goto switchD_001a272d_caseD_a;
      case 3:
        goto switchD_001a272d_caseD_9;
      case 4:
        goto switchD_001a2bbc_caseD_4;
      case 5:
        goto switchD_001a2bbc_caseD_5;
      case 6:
        goto switchD_001a272d_caseD_6;
      }
    case 0xd:
      printi256mem(MI,2,O);
      switch(uVar6 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a2bbc_caseD_1;
      case 2:
        goto switchD_001a272d_caseD_a;
      case 3:
        goto switchD_001a272d_caseD_9;
      case 4:
        goto switchD_001a2bbc_caseD_4;
      case 5:
        goto switchD_001a2bbc_caseD_5;
      case 6:
        goto switchD_001a272d_caseD_6;
      }
    case 0xe:
      pMVar8 = MCInst_getOperand(MI,2);
      iVar9 = MCOperand_getImm(pMVar8);
      uVar5 = (uint)iVar9 & 3;
      SStream_concat0(O,&DAT_002460c0 + *(int *)(&DAT_002460c0 + (ulong)uVar5 * 4));
      op_addAvxSae(MI);
      op_addAvxRoundingMode(MI,uVar5 + 1);
      break;
    case 0xf:
switchD_001a27a3_caseD_f:
      printf512mem(MI,3,O);
      break;
    case 0x10:
      printf64mem(MI,3,O);
      switch(uVar6 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a2bbc_caseD_1;
      case 2:
        goto switchD_001a272d_caseD_a;
      case 3:
        goto switchD_001a272d_caseD_9;
      case 4:
        goto switchD_001a2bbc_caseD_4;
      case 5:
        goto switchD_001a2bbc_caseD_5;
      case 6:
        goto switchD_001a272d_caseD_6;
      }
    case 0x11:
      printf32mem(MI,3,O);
      switch(uVar6 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a2bbc_caseD_1;
      case 2:
        goto switchD_001a272d_caseD_a;
      case 3:
        goto switchD_001a272d_caseD_9;
      case 4:
        goto switchD_001a2bbc_caseD_4;
      case 5:
        goto switchD_001a2bbc_caseD_5;
      case 6:
        goto switchD_001a272d_caseD_6;
      }
    case 0x12:
      printf128mem(MI,3,O);
      break;
    case 0x13:
      printf256mem(MI,3,O);
      break;
    case 0x14:
switchD_001a27a3_caseD_14:
      printi128mem(MI,3,O);
      break;
    case 0x15:
switchD_001a27a3_caseD_15:
      printi256mem(MI,3,O);
      break;
    case 0x16:
      uVar5 = 3;
LAB_001a2678:
      printi512mem(MI,uVar5,O);
      break;
    case 0x17:
      printi32mem(MI,3,O);
switchD_001a272d_caseD_9:
      SStream_concat0(O,"{1to16}");
      v = X86_AVX_BCAST_16;
LAB_001a2d43:
      op_addAvxBroadcast(MI,v);
      break;
    case 0x18:
      v = X86_AVX_BCAST_8;
      printi64mem(MI,3,O);
      pcVar12 = "{1to8}";
LAB_001a2b85:
      SStream_concat0(O,pcVar12);
      goto LAB_001a2d43;
    case 0x19:
      printi8mem(MI,2,O);
      goto LAB_001a29d9;
    case 0x1a:
      printi16mem(MI,2,O);
LAB_001a29d9:
      pcVar12 = ", ";
LAB_001a245d:
      SStream_concat0(O,pcVar12);
switchD_001a27a3_caseD_4:
      uVar5 = 7;
      goto LAB_001a24a6;
    default:
      printOperand(MI,6,O);
      switch(uVar6 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a2bbc_caseD_1;
      case 2:
        goto switchD_001a272d_caseD_a;
      case 3:
        goto switchD_001a272d_caseD_9;
      case 4:
        goto switchD_001a2bbc_caseD_4;
      case 5:
        goto switchD_001a2bbc_caseD_5;
      case 6:
        goto switchD_001a272d_caseD_6;
      }
    }
    break;
  case 5:
    SStream_concat0(O,"} {z}, ");
    op_addAvxZeroOpmask(MI);
    goto LAB_001a277f;
  case 6:
    goto switchD_001a272d_caseD_6;
  case 7:
    printi64mem(MI,4,O);
    break;
  case 8:
    printi32mem(MI,4,O);
    break;
  case 9:
    goto switchD_001a272d_caseD_9;
  case 10:
    goto switchD_001a272d_caseD_a;
  }
switchD_001a1ebb_default:
  uVar5 = MCInst_getOpcode(MI);
  xVar7 = X86_insn_reg_intel(uVar5);
  uVar14 = (ulong)xVar7;
  if (MI->csh->detail != CS_OPT_OFF) {
    reg = xVar7;
    if (xVar7 == X86_REG_INVALID) {
      uVar5 = MCInst_getOpcode(MI);
      _Var4 = X86_insn_reg_intel2(uVar5,&reg,&reg2);
      uVar14 = (ulong)reg;
      if (_Var4) {
        (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = reg;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50) = MI->csh->regsize_map[uVar14];
        (MI->flat_insn->detail->field_6).x86.operands[1].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[1].field_1.reg = reg2;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x80) = MI->csh->regsize_map[reg2];
        (MI->flat_insn->detail->field_6).x86.op_count = '\x02';
      }
    }
    else {
      pcVar3 = MI->flat_insn->detail;
      memmove((void *)((long)&pcVar3->field_6 + 0x60),(void *)((long)&pcVar3->field_6 + 0x30),0x150)
      ;
      (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
      (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = xVar7;
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50) = MI->csh->regsize_map[xVar7];
      puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  if ((int)uVar14 != 0 && MI->op1_size == '\0') {
    MI->op1_size = MI->csh->regsize_map[uVar14];
  }
  return;
switchD_001a2bbc_caseD_1:
  SStream_concat0(O,", ");
  switch(uVar6 >> 0xb & 0xf) {
  case 0:
    uVar5 = 4;
    goto LAB_001a2c9e;
  case 1:
    uVar5 = 7;
    goto LAB_001a2c9e;
  case 2:
    printf64mem(MI,3,O);
    break;
  case 3:
    goto switchD_001a27a3_caseD_f;
  case 4:
    uVar5 = 3;
LAB_001a2c9e:
    printOperand(MI,uVar5,O);
    break;
  case 5:
    printf32mem(MI,3,O);
    break;
  case 6:
    printf128mem(MI,3,O);
    break;
  case 7:
    printf256mem(MI,3,O);
    break;
  case 8:
    v = X86_AVX_BCAST_16;
    printi32mem(MI,4,O);
    pcVar12 = "{1to16}";
    goto LAB_001a2b85;
  case 9:
    printi32mem(MI,3,O);
    break;
  case 10:
    uVar5 = 4;
    goto LAB_001a2678;
  case 0xb:
    printi512mem(MI,3,O);
    break;
  case 0xc:
    printi64mem(MI,4,O);
    goto switchD_001a272d_caseD_a;
  case 0xd:
    printi64mem(MI,3,O);
    break;
  case 0xe:
    goto switchD_001a27a3_caseD_14;
  case 0xf:
    goto switchD_001a27a3_caseD_15;
  }
  switch(uVar6 >> 0xf & 7) {
  case 1:
    SStream_concat0(O,", ");
    uVar5 = uVar6 >> 0x12 & 3;
    if (uVar5 == 1) {
      uVar5 = 5;
    }
    else if (uVar5 == 2) {
      uVar5 = 4;
    }
    else {
LAB_001a26dc:
      uVar5 = 8;
    }
LAB_001a24a6:
    printOperand(MI,uVar5,O);
    goto switchD_001a1ebb_default;
  case 2:
switchD_001a272d_caseD_a:
    SStream_concat0(O,"{1to8}");
    v = X86_AVX_BCAST_8;
    break;
  case 3:
    goto switchD_001a272d_caseD_9;
  case 4:
switchD_001a2bbc_caseD_4:
    SStream_concat0(O,"{1to4}");
    v = X86_AVX_BCAST_4;
    break;
  case 5:
switchD_001a2bbc_caseD_5:
    SStream_concat0(O,"{1to2}");
    v = X86_AVX_BCAST_2;
    break;
  default:
    goto switchD_001a1ebb_default;
  }
  goto LAB_001a2d43;
}

Assistant:

void X86_Intel_printInst(MCInst *MI, SStream *O, void *Info)
{
	char *mnem;
	x86_reg reg, reg2;

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, Info);
	if (mnem)
		cs_mem_free(mnem);
	else
		printInstruction(MI, O, Info);

	reg = X86_insn_reg_intel(MCInst_getOpcode(MI));
	if (MI->csh->detail) {
		// first op can be embedded in the asm by llvm.
		// so we have to add the missing register as the first operand
		if (reg) {
			// shift all the ops right to leave 1st slot for this new register op
			memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
					sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
			MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
			MI->flat_insn->detail->x86.operands[0].reg = reg;
			MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.op_count++;
		} else {
			if (X86_insn_reg_intel2(MCInst_getOpcode(MI), &reg, &reg2)) {
				MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[0].reg = reg;
				MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.operands[1].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[1].reg = reg2;
				MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg2];
				MI->flat_insn->detail->x86.op_count = 2;
			}
		}
	}

	if (MI->op1_size == 0 && reg)
		MI->op1_size = MI->csh->regsize_map[reg];
}